

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_isdir(zip_t *zip)

{
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else if ((zip->entry).index < 0) {
    zip_local._4_4_ = -1;
  }
  else {
    zip_local._4_4_ = mz_zip_reader_is_file_a_directory(&zip->archive,(zip->entry).index);
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_isdir(struct zip_t *zip) {
  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  if (zip->entry.index < 0) {
    // zip entry is not opened
    return -1;
  }

  return (int)mz_zip_reader_is_file_a_directory(&zip->archive,
                                                (mz_uint)zip->entry.index);
}